

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

void mon_create_mimicked_object(chunk *c,monster *mon,wchar_t index)

{
  loc grid;
  _Bool _Var1;
  uint8_t uVar2;
  uint32_t uVar3;
  object *obj_00;
  object_kind *kind;
  monster_mimic *pmVar4;
  uint32_t m;
  _Bool dummy;
  object *obj;
  
  pmVar4 = mon->race->mimic_kinds;
  kind = pmVar4->kind;
  dummy = true;
  m = 1;
  for (; pmVar4 != (monster_mimic *)0x0; pmVar4 = pmVar4->next) {
    uVar3 = Rand_div(m);
    if (uVar3 == 0) {
      kind = pmVar4->kind;
    }
    m = m + 1;
  }
  _Var1 = tval_is_money_k(kind);
  if (_Var1) {
    obj_00 = make_gold(c->depth,kind->name);
    obj = obj_00;
  }
  else {
    obj_00 = object_new();
    obj = obj_00;
    object_prep(obj_00,kind,mon->race->level,RANDOMISE);
    apply_magic(obj_00,mon->race->level,true,false,false,false);
    obj_00->number = '\x01';
    obj_00->origin = '\x18';
    uVar2 = convert_depth_to_origin(c->depth);
    obj_00->origin_depth = uVar2;
  }
  obj_00->mimicking_m_idx = (int16_t)index;
  mon->mimicked_obj = obj_00;
  grid.x = (mon->grid).x;
  grid.y = (mon->grid).y;
  _Var1 = floor_carry(c,grid,obj_00,&dummy);
  if (_Var1) {
    list_object((chunk_conflict *)c,obj_00);
  }
  else {
    obj_00->mimicking_m_idx = 0;
    mon->mimicked_obj = (object *)0x0;
    _Var1 = flag_has_dbg(mon->race->flags,0xb,0x18,"mon->race->flags","RF_MIMIC_INV");
    if (_Var1) {
      monster_carry(c,(monster_conflict *)mon,obj_00);
    }
    else {
      object_delete(c,(chunk *)0x0,&obj);
    }
  }
  return;
}

Assistant:

void mon_create_mimicked_object(struct chunk *c, struct monster *mon, int index)
{
	struct object *obj;
	struct object_kind *kind = mon->race->mimic_kinds->kind;
	struct monster_mimic *mimic_kind;
	int i = 1;
	bool dummy = true;

	/* Pick a random object kind to mimic */
	for (mimic_kind = mon->race->mimic_kinds;
		 mimic_kind;
		 mimic_kind = mimic_kind->next, i++) {
		if (one_in_(i)) {
			kind = mimic_kind->kind;
		}
	}

	if (tval_is_money_k(kind)) {
		obj = make_gold(c->depth, kind->name);
	} else {
		obj = object_new();
		object_prep(obj, kind, mon->race->level, RANDOMISE);
		apply_magic(obj, mon->race->level, true, false, false, false);
		obj->number = 1;
		obj->origin = ORIGIN_DROP_MIMIC;
		obj->origin_depth = convert_depth_to_origin(c->depth);
	}

	obj->mimicking_m_idx = index;
	mon->mimicked_obj = obj;

	/* Put the object on the floor if it goes, otherwise no mimicry */
	if (floor_carry(c, mon->grid, obj, &dummy)) {
		list_object(c, obj);
	} else {
		/* Clear the mimicry */
		obj->mimicking_m_idx = 0;
		mon->mimicked_obj = NULL;

		/* Give the object to the monster if appropriate */
		if (rf_has(mon->race->flags, RF_MIMIC_INV)) {
			monster_carry(c, mon, obj);
		} else {
			/* Otherwise delete the mimicked object */
			object_delete(c, NULL, &obj);
		}
	}
}